

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O2

void __thiscall
cbtPairCachingGhostObject::addOverlappingObjectInternal
          (cbtPairCachingGhostObject *this,cbtBroadphaseProxy *otherProxy,
          cbtBroadphaseProxy *thisProxy)

{
  cbtAlignedObjectArray<cbtCollisionObject_*> *this_00;
  int iVar1;
  cbtBroadphaseProxy *pcVar2;
  cbtCollisionObject *otherObject;
  cbtCollisionObject *local_30;
  
  local_30 = (cbtCollisionObject *)otherProxy->m_clientObject;
  pcVar2 = (this->super_cbtGhostObject).super_cbtCollisionObject.m_broadphaseHandle;
  this_00 = &(this->super_cbtGhostObject).m_overlappingObjects;
  iVar1 = cbtAlignedObjectArray<cbtCollisionObject_*>::findLinearSearch(this_00,&local_30);
  if (iVar1 == (this->super_cbtGhostObject).m_overlappingObjects.m_size) {
    if (thisProxy != (cbtBroadphaseProxy *)0x0) {
      pcVar2 = thisProxy;
    }
    cbtAlignedObjectArray<cbtCollisionObject_*>::push_back(this_00,&local_30);
    (*(this->m_hashPairCache->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
      _vptr_cbtOverlappingPairCallback[2])(this->m_hashPairCache,pcVar2,otherProxy);
  }
  return;
}

Assistant:

void cbtPairCachingGhostObject::addOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtBroadphaseProxy* thisProxy)
{
	cbtBroadphaseProxy* actualThisProxy = thisProxy ? thisProxy : getBroadphaseHandle();
	cbtAssert(actualThisProxy);

	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtAssert(otherObject);
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index == m_overlappingObjects.size())
	{
		m_overlappingObjects.push_back(otherObject);
		m_hashPairCache->addOverlappingPair(actualThisProxy, otherProxy);
	}
}